

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void KokkosTools::SpaceTimeStack::print_process_hwm(bool mpi_usable)

{
  rusage sys_resources;
  
  getrusage(RUSAGE_SELF,(rusage *)&sys_resources);
  printf("Host process high water mark memory consumption: %ld kB\n",sys_resources.field_2.ru_maxrss
        );
  putchar(10);
  return;
}

Assistant:

void print_process_hwm(bool mpi_usable) {
  struct rusage sys_resources;
  getrusage(RUSAGE_SELF, &sys_resources);
  long hwm     = sys_resources.ru_maxrss;
  long hwm_max = hwm;

#if USE_MPI
  if (mpi_usable) {
    int rank, world_size;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &world_size);

    // Max
    MPI_Reduce(&hwm, &hwm_max, 1, MPI_LONG, MPI_MAX, 0, MPI_COMM_WORLD);

    // Min
    long hwm_min;
    MPI_Reduce(&hwm, &hwm_min, 1, MPI_LONG, MPI_MIN, 0, MPI_COMM_WORLD);

    // Average
    MPI_Comm_size(MPI_COMM_WORLD, &world_size);
    long hwm_ave;
    MPI_Reduce(&hwm, &hwm_ave, 1, MPI_LONG, MPI_SUM, 0, MPI_COMM_WORLD);
    hwm_ave /= world_size;

    if (rank == 0) {
      printf("Host process high water mark memory consumption: %ld kB\n",
             hwm_max);
      printf("  Max: %ld, Min: %ld, Ave: %ld kB\n", hwm_max, hwm_min, hwm_ave);
      printf("\n");
    }
  } else
#else
  (void)mpi_usable;
#endif
  {
    printf("Host process high water mark memory consumption: %ld kB\n",
           hwm_max);
    printf("\n");
  }
}